

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall
wabt::OptionParser::OptionParser(OptionParser *this,char *program_name,char *description)

{
  char *pcVar1;
  anon_class_1_0_00000001 local_79;
  NullCallback local_78;
  anon_class_8_1_8991fb9c local_58;
  NullCallback local_50;
  anon_class_8_1_8991fb9c local_30;
  allocator local_22;
  allocator local_21;
  char *local_20;
  char *description_local;
  char *program_name_local;
  OptionParser *this_local;
  
  local_20 = description;
  description_local = program_name;
  program_name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,program_name,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->description_,pcVar1,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::vector
            (&this->options_);
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::vector
            (&this->arguments_);
  local_30.this = this;
  std::function<void(char_const*)>::
  function<wabt::OptionParser::OptionParser(char_const*,char_const*)::__0,void>
            ((function<void(char_const*)> *)&this->on_error_,&local_30);
  local_58.this = this;
  std::function<void()>::
  function<wabt::OptionParser::OptionParser(char_const*,char_const*)::__1,void>
            ((function<void()> *)&local_50,&local_58);
  AddOption(this,"help","Print this help message",&local_50);
  std::function<void_()>::~function(&local_50);
  std::function<void()>::
  function<wabt::OptionParser::OptionParser(char_const*,char_const*)::__2,void>
            ((function<void()> *)&local_78,&local_79);
  AddOption(this,"version","Print version information",&local_78);
  std::function<void_()>::~function(&local_78);
  return;
}

Assistant:

OptionParser::OptionParser(const char* program_name, const char* description)
    : program_name_(program_name),
      description_(description),
      on_error_([this](const std::string& message) { DefaultError(message); }) {

  // Add common options
  AddOption("help", "Print this help message", [this]() {
    PrintHelp();
    exit(0);
  });
  AddOption("version", "Print version information", []() {
    printf("%s\n", CMAKE_PROJECT_VERSION);
    exit(0);
  });
}